

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

Error asmjit::v1_14::Formatter::formatOperand
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,Operand_ *op)

{
  uint uVar1;
  undefined3 uVar2;
  Error EVar3;
  Error EVar4;
  uint32_t uVar5;
  RegType RVar6;
  ShiftOp shiftOp;
  FormatFlags FVar7;
  StringFormatFlags SVar8;
  ulong uVar9;
  bool bVar10;
  
  if ((byte)(arch - k32BitMask) < 2) {
    EVar3 = x86::FormatterInternal::formatOperand(sb,formatFlags,emitter,arch,op);
    return EVar3;
  }
  if ((kThumb_BE < arch) || ((0x38e0U >> (arch & 0x1f) & 1) == 0)) {
    return 4;
  }
  uVar1 = (op->_signature)._bits;
  uVar2 = (undefined3)(uVar1 >> 8);
  switch(uVar1 & 7) {
  case 1:
    uVar5 = 0xffffffff;
    if ((short)uVar1 < 0) {
      uVar5 = uVar1 >> 0x10 & 0xf;
    }
    RVar6 = (byte)uVar1 >> 3;
    EVar3 = arm::FormatterInternal::formatRegister
                      (sb,CONCAT31(uVar2,RVar6),emitter,arch,RVar6,op->_baseId,uVar1 >> 0xc & 7,
                       uVar5);
    break;
  case 2:
    FVar7 = kMachineCode;
    EVar3 = String::_opChar(sb,kAppend,'[');
    if (EVar3 != 0) {
      return EVar3;
    }
    uVar1 = (op->_signature)._bits;
    EVar3 = 0;
    if ((uVar1 & 0xf8) == 0) {
      if ((uVar1 & 0x1f00) == 0) {
        uVar5 = 0;
        if ((uVar1 & 0xf8) == 0) {
          uVar5 = op->_baseId;
        }
        if (uVar5 == 0 && op->_data[1] == 0) goto LAB_0012dbef;
      }
      EVar4 = String::_opString(sb,kAppend,"<None>",0xffffffffffffffff);
LAB_0012db8e:
      if (EVar4 != 0) {
        return EVar4;
      }
    }
    else {
      if ((uVar1 & 0xf8) == 8) {
        EVar4 = formatLabel(sb,formatFlags,emitter,op->_baseId);
        goto LAB_0012db8e;
      }
      if ((uVar1 >> 0xd & 1) == 0) {
LAB_0012dbba:
        EVar4 = arm::FormatterInternal::formatRegister
                          (sb,FVar7,emitter,arch,(byte)(op->_signature)._bits >> 3,op->_baseId,0,
                           0xffffffff);
        bVar10 = EVar4 == 0;
        if (!bVar10) {
          EVar3 = EVar4;
        }
      }
      else {
        FVar7 = kMachineCode;
        EVar4 = String::_opChar(sb,kAppend,'&');
        if (EVar4 == 0) goto LAB_0012dbba;
        bVar10 = false;
        EVar3 = EVar4;
      }
      if (!bVar10) {
        return EVar3;
      }
    }
LAB_0012dbef:
    if ((((op->_signature)._bits & 0x3000000) == 0x2000000) &&
       (EVar4 = String::_opChar(sb,kAppend,']'), EVar4 != 0)) {
      return EVar4;
    }
    if (((op->_signature)._bits & 0x1f00) != 0) {
      FVar7 = kMachineCode;
      EVar4 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
      EVar4 = arm::FormatterInternal::formatRegister
                        (sb,FVar7,emitter,arch,(RegType)((op->_signature)._bits >> 8) & kMaxValue,
                         op->_data[0],0,0xffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
    }
    uVar5 = 0;
    if (((op->_signature)._bits & 0xf8) == 0) {
      uVar5 = op->_baseId;
    }
    if (uVar5 != 0 || op->_data[1] != 0) {
      EVar4 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
      uVar9 = CONCAT44(op->_baseId,op->_data[1]);
      if (((op->_signature)._bits & 0xf8) != 0) {
        uVar9 = (long)(int)op->_data[1];
      }
      uVar5 = 0x10;
      if (((byte)formatFlags >> 3 & 9 < uVar9) == 0) {
        uVar5 = 10;
        SVar8 = kSigned;
LAB_0012dd32:
        bVar10 = false;
        EVar4 = String::_opNumber(sb,kAppend,uVar9,uVar5,0,SVar8);
        if (EVar4 == 0) {
          bVar10 = true;
          EVar4 = EVar3;
        }
      }
      else {
        EVar4 = String::_opString(sb,kAppend,"0x",0xffffffffffffffff);
        if (EVar4 == 0) {
          SVar8 = kNone;
          goto LAB_0012dd32;
        }
        bVar10 = false;
      }
      if (!bVar10) {
        return EVar4;
      }
    }
    if ((((((op->_signature)._bits & 0x7c000) == 0) ||
         ((EVar3 = String::_opChar(sb,kAppend,' '), EVar3 == 0 &&
          (((uVar1 = (op->_signature)._bits, (uVar1 & 0x3000000) != 0 ||
            (EVar3 = arm::FormatterInternal::formatShiftOp(sb,uVar1 >> 0x14 & (kSXTW|kROR)),
            EVar3 == 0)) &&
           (EVar3 = String::_opFormat(sb,kAppend," %u",(ulong)((op->_signature)._bits >> 0xe & 0x1f)
                                     ), EVar3 == 0)))))) &&
        ((((op->_signature)._bits & 0x3000000) == 0x2000000 ||
         (EVar3 = String::_opChar(sb,kAppend,']'), EVar3 == 0)))) &&
       ((((op->_signature)._bits & 0x3000000) != 0x1000000 ||
        (EVar3 = String::_opChar(sb,kAppend,'!'), EVar3 == 0)))) {
      EVar3 = 0;
    }
    break;
  case 3:
    RVar6 = (byte)uVar1 >> 3;
    EVar3 = arm::FormatterInternal::formatRegisterList
                      (sb,CONCAT31(uVar2,RVar6),emitter,arch,RVar6,op->_baseId);
    return EVar3;
  case 4:
    uVar9 = *(ulong *)op->_data;
    shiftOp = uVar1 >> 0x14 & (kSXTW|kROR);
    if ((shiftOp == kLSL) ||
       ((EVar3 = arm::FormatterInternal::formatShiftOp(sb,shiftOp), EVar3 == 0 &&
        (EVar3 = String::_opChar(sb,kAppend,' '), EVar3 == 0)))) {
      if (((formatFlags & kHexImms) == kNone) || (uVar9 < 10)) {
        uVar5 = 10;
        SVar8 = kSigned;
      }
      else {
        EVar3 = String::_opString(sb,kAppend,"0x",0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
        uVar5 = 0x10;
        SVar8 = kNone;
      }
      EVar3 = String::_opNumber(sb,kAppend,uVar9,uVar5,0,SVar8);
      return EVar3;
    }
    break;
  case 5:
    EVar3 = formatLabel(sb,formatFlags,emitter,op->_baseId);
    return EVar3;
  default:
    EVar3 = String::_opString(sb,kAppend,"<None>",0xffffffffffffffff);
    return EVar3;
  }
  return EVar3;
}

Assistant:

Error formatOperand(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  Arch arch,
  const Operand_& op) noexcept {

#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::FormatterInternal::formatOperand(sb, formatFlags, emitter, arch, op);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyARM(arch))
    return arm::FormatterInternal::formatOperand(sb, formatFlags, emitter, arch, op);
#endif

  return kErrorInvalidArch;
}